

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

char * mcpl_internal_calloc(size_t num,size_t size)

{
  char *pcVar1;
  size_t in_RSI;
  size_t in_RDI;
  char *res;
  undefined8 local_30;
  undefined8 local_20;
  
  local_20 = in_RDI;
  if (in_RDI == 0) {
    local_20 = 1;
  }
  local_30 = in_RSI;
  if (in_RSI == 0) {
    local_30 = 1;
  }
  pcVar1 = (char *)calloc(local_20,local_30);
  if (pcVar1 == (char *)0x0) {
    mcpl_error((char *)0x101520);
  }
  return pcVar1;
}

Assistant:

MCPL_LOCAL char * mcpl_internal_calloc(size_t num, size_t size)
{
  char * res = (char*)calloc( ( num ? num : 1 ),
                              ( size ? size : 1 ) );
  if (!res)
    mcpl_error("memory allocation failed");
  return res;
}